

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_sha2.c
# Opt level: O2

void cmSHA512_Final(sha_byte *digest,SHA_CTX *context)

{
  int j;
  long lVar1;
  ulong uVar2;
  
  if (context != (SHA_CTX *)0x0) {
    if (digest != (sha_byte *)0x0) {
      cmSHA512_Internal_Last(context);
      for (lVar1 = 0; lVar1 != 8; lVar1 = lVar1 + 1) {
        uVar2 = *(ulong *)((long)context + lVar1 * 8);
        uVar2 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
                (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 |
                (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 |
                uVar2 << 0x38;
        *(ulong *)((long)context + lVar1 * 8) = uVar2;
        *(ulong *)(digest + lVar1 * 8) = uVar2;
      }
    }
    memset(context,0,0xd0);
    return;
  }
  __assert_fail("context != (SHA_CTX*)0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cm_sha2.c"
                ,0x5d2,"void cmSHA512_Final(sha_byte *, SHA_CTX *)");
}

Assistant:

void SHA512_Final(sha_byte digest[], SHA_CTX* context) {
	sha_word64	*d = (sha_word64*)digest;

	/* Sanity check: */
	assert(context != (SHA_CTX*)0);

	/* If no digest buffer is passed, we don't bother doing this: */
	if (digest != (sha_byte*)0) {
		SHA512_Internal_Last(context);

		/* Save the hash data for output: */
#if BYTE_ORDER == LITTLE_ENDIAN
		{
			/* Convert TO host byte order */
			int	j;
			for (j = 0; j < (SHA512_DIGEST_LENGTH >> 3); j++) {
				REVERSE64(context->s512.state[j],context->s512.state[j]);
				*d++ = context->s512.state[j];
			}
		}
#else
		MEMCPY_BCOPY(d, context->s512.state, SHA512_DIGEST_LENGTH);
#endif
	}

	/* Zero out state data */
	MEMSET_BZERO(context, sizeof(*context));
}